

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O2

WORD32 ihevcd_parse_pred_wt_ofst
                 (bitstrm_t *ps_bitstrm,sps_t *ps_sps,pps_t *ps_pps,slice_header_t *ps_slice_hdr)

{
  short sVar1;
  WORD16 WVar2;
  UWORD32 UVar3;
  WORD32 WVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  
  UVar3 = ihevcd_uev(ps_bitstrm);
  (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom = (WORD8)UVar3;
  if (ps_sps->i1_chroma_format_idc != '\0') {
    WVar4 = ihevcd_sev(ps_bitstrm);
    (ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom =
         (char)WVar4 + (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom;
  }
  lVar9 = 0;
  while( true ) {
    bVar8 = ps_slice_hdr->i1_num_ref_idx_l0_active;
    uVar6 = (ulong)(char)bVar8;
    if ((long)uVar6 <= lVar9) break;
    UVar3 = ihevcd_bits_get(ps_bitstrm,1);
    (ps_slice_hdr->s_wt_ofst).i1_luma_weight_l0_flag[lVar9] = (WORD8)UVar3;
    lVar9 = lVar9 + 1;
  }
  if (ps_sps->i1_chroma_format_idc == '\0') {
    uVar7 = 0;
    if ((char)bVar8 < '\x01') {
      bVar8 = 0;
    }
    for (; bVar8 != uVar7; uVar7 = uVar7 + 1) {
      (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag[uVar7] = '\0';
    }
  }
  else {
    for (lVar9 = 0; lVar9 < (char)uVar6; lVar9 = lVar9 + 1) {
      UVar3 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag[lVar9] = (WORD8)UVar3;
      uVar6 = (ulong)(byte)ps_slice_hdr->i1_num_ref_idx_l0_active;
    }
  }
  for (lVar9 = 0; lVar9 < (char)uVar6; lVar9 = lVar9 + 1) {
    if ((ps_slice_hdr->s_wt_ofst).i1_luma_weight_l0_flag[lVar9] == '\0') {
      bVar8 = (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1f;
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l0[lVar9] = (WORD16)(1 << bVar8);
      WVar2 = (WORD16)(0 << bVar8);
    }
    else {
      WVar4 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l0[lVar9] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU)) +
           (short)WVar4;
      WVar4 = ihevcd_sev(ps_bitstrm);
      WVar2 = (WORD16)WVar4;
    }
    (ps_slice_hdr->s_wt_ofst).i2_luma_offset_l0[lVar9] = WVar2;
    if ((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l0_flag[lVar9] == '\0') {
      bVar8 = (ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1f;
      WVar2 = (WORD16)(1 << bVar8);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar9] = WVar2;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar9] = WVar2;
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cb[lVar9] = 0;
      sVar1 = (short)(0 << bVar8);
    }
    else {
      WVar4 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar9] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar4;
      WVar4 = ihevcd_sev(ps_bitstrm);
      iVar5 = WVar4 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cb[lVar9] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar5 < -0xff) {
        iVar5 = -0x100;
      }
      if (-2 < iVar5) {
        iVar5 = -1;
      }
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cb[lVar9] = (short)iVar5 + 0x80;
      WVar4 = ihevcd_sev(ps_bitstrm);
      (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar9] =
           (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
           (short)WVar4;
      WVar4 = ihevcd_sev(ps_bitstrm);
      iVar5 = WVar4 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l0_cr[lVar9] << 7) >>
                      ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
      if (iVar5 < -0xff) {
        iVar5 = -0x100;
      }
      if (-2 < iVar5) {
        iVar5 = -1;
      }
      sVar1 = (short)iVar5 + 0x80;
    }
    (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l0_cr[lVar9] = sVar1;
    uVar6 = (ulong)(byte)ps_slice_hdr->i1_num_ref_idx_l0_active;
  }
  if (ps_slice_hdr->i1_slice_type == '\0') {
    lVar9 = 0;
    while( true ) {
      bVar8 = ps_slice_hdr->i1_num_ref_idx_l1_active;
      uVar6 = (ulong)(char)bVar8;
      if ((long)uVar6 <= lVar9) break;
      UVar3 = ihevcd_bits_get(ps_bitstrm,1);
      (ps_slice_hdr->s_wt_ofst).i1_luma_weight_l1_flag[lVar9] = (WORD8)UVar3;
      lVar9 = lVar9 + 1;
    }
    if (ps_sps->i1_chroma_format_idc == '\0') {
      uVar7 = 0;
      if ((char)bVar8 < '\x01') {
        bVar8 = 0;
      }
      for (; bVar8 != uVar7; uVar7 = uVar7 + 1) {
        (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag[uVar7] = '\0';
      }
    }
    else {
      for (lVar9 = 0; lVar9 < (char)uVar6; lVar9 = lVar9 + 1) {
        UVar3 = ihevcd_bits_get(ps_bitstrm,1);
        (ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag[lVar9] = (WORD8)UVar3;
        uVar6 = (ulong)(byte)ps_slice_hdr->i1_num_ref_idx_l1_active;
      }
    }
    for (lVar9 = 0; lVar9 < (char)uVar6; lVar9 = lVar9 + 1) {
      if ((ps_slice_hdr->s_wt_ofst).i1_luma_weight_l1_flag[lVar9] == '\0') {
        bVar8 = (ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1f;
        (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l1[lVar9] = (WORD16)(1 << bVar8);
        WVar2 = (WORD16)(0 << bVar8);
      }
      else {
        WVar4 = ihevcd_sev(ps_bitstrm);
        (ps_slice_hdr->s_wt_ofst).i2_luma_weight_l1[lVar9] =
             (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_luma_log2_weight_denom & 0x1fU)) +
             (short)WVar4;
        WVar4 = ihevcd_sev(ps_bitstrm);
        WVar2 = (WORD16)WVar4;
      }
      (ps_slice_hdr->s_wt_ofst).i2_luma_offset_l1[lVar9] = WVar2;
      if ((ps_slice_hdr->s_wt_ofst).i1_chroma_weight_l1_flag[lVar9] == '\0') {
        bVar8 = (ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1f;
        WVar2 = (WORD16)(1 << bVar8);
        (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar9] = WVar2;
        (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar9] = WVar2;
        (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cb[lVar9] = 0;
        sVar1 = (short)(0 << bVar8);
      }
      else {
        WVar4 = ihevcd_sev(ps_bitstrm);
        (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar9] =
             (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
             (short)WVar4;
        WVar4 = ihevcd_sev(ps_bitstrm);
        iVar5 = WVar4 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cb[lVar9] << 7) >>
                        ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
        if (iVar5 < -0xff) {
          iVar5 = -0x100;
        }
        if (-2 < iVar5) {
          iVar5 = -1;
        }
        (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cb[lVar9] = (short)iVar5 + 0x80;
        WVar4 = ihevcd_sev(ps_bitstrm);
        (ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar9] =
             (short)(1 << ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU)) +
             (short)WVar4;
        WVar4 = ihevcd_sev(ps_bitstrm);
        iVar5 = WVar4 - (((int)(ps_slice_hdr->s_wt_ofst).i2_chroma_weight_l1_cr[lVar9] << 7) >>
                        ((ps_slice_hdr->s_wt_ofst).i1_chroma_log2_weight_denom & 0x1fU));
        if (iVar5 < -0xff) {
          iVar5 = -0x100;
        }
        if (-2 < iVar5) {
          iVar5 = -1;
        }
        sVar1 = (short)iVar5 + 0x80;
      }
      (ps_slice_hdr->s_wt_ofst).i2_chroma_offset_l1_cr[lVar9] = sVar1;
      uVar6 = (ulong)(byte)ps_slice_hdr->i1_num_ref_idx_l1_active;
    }
  }
  return 0;
}

Assistant:

WORD32 ihevcd_parse_pred_wt_ofst(bitstrm_t *ps_bitstrm,
                                 sps_t *ps_sps,
                                 pps_t *ps_pps,
                                 slice_header_t *ps_slice_hdr)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 value;
    WORD32 i;

    pred_wt_ofst_t *ps_wt_ofst = &ps_slice_hdr->s_wt_ofst;
    UNUSED(ps_pps);

    UEV_PARSE("luma_log2_weight_denom", value, ps_bitstrm);
    ps_wt_ofst->i1_luma_log2_weight_denom = value;

    if(ps_sps->i1_chroma_format_idc != 0)
    {
        SEV_PARSE("delta_chroma_log2_weight_denom", value, ps_bitstrm);
        ps_wt_ofst->i1_chroma_log2_weight_denom = ps_wt_ofst->i1_luma_log2_weight_denom + value;
    }

    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        BITS_PARSE("luma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
        ps_wt_ofst->i1_luma_weight_l0_flag[i] = value;
    }



    if(ps_sps->i1_chroma_format_idc != 0)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            BITS_PARSE("chroma_weight_l0_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = value;
        }
    }
    else
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
        {
            ps_wt_ofst->i1_chroma_weight_l0_flag[i] = 0;
        }
    }


    for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l0_active; i++)
    {
        if(ps_wt_ofst->i1_luma_weight_l0_flag[i])
        {
            SEV_PARSE("delta_luma_weight_l0[ i ]", value, ps_bitstrm);


            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

            SEV_PARSE("luma_offset_l0[ i ]", value, ps_bitstrm);
            ps_wt_ofst->i2_luma_offset_l0[i] = value;

        }
        else
        {
            ps_wt_ofst->i2_luma_weight_l0[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
            ps_wt_ofst->i2_luma_offset_l0[i] = 0;
        }
        if(ps_wt_ofst->i1_chroma_weight_l0_flag[i])
        {
            WORD32 ofst;
            WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = CLIP_S8(ofst);

            SEV_PARSE("delta_chroma_weight_l0[ i ][ j ]", value, ps_bitstrm);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


            SEV_PARSE("delta_chroma_offset_l0[ i ][ j ]", value, ps_bitstrm);
            ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l0_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
            ofst = value - ofst + shift;

            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = CLIP_S8(ofst);

        }
        else
        {
            ps_wt_ofst->i2_chroma_weight_l0_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
            ps_wt_ofst->i2_chroma_weight_l0_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

            ps_wt_ofst->i2_chroma_offset_l0_cb[i] = 0;
            ps_wt_ofst->i2_chroma_offset_l0_cr[i] = 0;
        }
    }
    if(BSLICE == ps_slice_hdr->i1_slice_type)
    {
        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            BITS_PARSE("luma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
            ps_wt_ofst->i1_luma_weight_l1_flag[i] = value;
        }

        if(ps_sps->i1_chroma_format_idc != 0)
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                BITS_PARSE("chroma_weight_l1_flag[ i ]", value, ps_bitstrm, 1);
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = value;
            }
        }
        else
        {
            for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
            {
                ps_wt_ofst->i1_chroma_weight_l1_flag[i] = 0;
            }
        }

        for(i = 0; i < ps_slice_hdr->i1_num_ref_idx_l1_active; i++)
        {
            if(ps_wt_ofst->i1_luma_weight_l1_flag[i])
            {
                SEV_PARSE("delta_luma_weight_l1[ i ]", value, ps_bitstrm);


                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom) + value;

                SEV_PARSE("luma_offset_l1[ i ]", value, ps_bitstrm);
                ps_wt_ofst->i2_luma_offset_l1[i] = value;

            }
            else
            {
                ps_wt_ofst->i2_luma_weight_l1[i] = (1 << ps_wt_ofst->i1_luma_log2_weight_denom);
                ps_wt_ofst->i2_luma_offset_l1[i] = 0;
            }

            if(ps_wt_ofst->i1_chroma_weight_l1_flag[i])
            {
                WORD32 ofst;
                WORD32 shift = (1 << (BIT_DEPTH_CHROMA - 1));
                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cb[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = CLIP_S8(ofst);;

                SEV_PARSE("delta_chroma_weight_l1[ i ][ j ]", value, ps_bitstrm);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom) + value;


                SEV_PARSE("delta_chroma_offset_l1[ i ][ j ]", value, ps_bitstrm);
                ofst = ((shift * ps_wt_ofst->i2_chroma_weight_l1_cr[i]) >> ps_wt_ofst->i1_chroma_log2_weight_denom);
                ofst = value - ofst + shift;

                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = CLIP_S8(ofst);;

            }
            else
            {
                ps_wt_ofst->i2_chroma_weight_l1_cb[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);
                ps_wt_ofst->i2_chroma_weight_l1_cr[i] = (1 << ps_wt_ofst->i1_chroma_log2_weight_denom);

                ps_wt_ofst->i2_chroma_offset_l1_cb[i] = 0;
                ps_wt_ofst->i2_chroma_offset_l1_cr[i] = 0;

            }
        }
    }
    return ret;
}